

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypter.cpp
# Opt level: O2

bool wallet::EncryptSecret
               (CKeyingMaterial *vMasterKey,CKeyingMaterial *vchPlaintext,uint256 *nIV,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *vchCiphertext)

{
  long lVar1;
  undefined8 uVar2;
  bool bVar3;
  long in_FS_OFFSET;
  span<const_unsigned_char,_18446744073709551615UL> new_iv;
  allocator_type local_79;
  vector<unsigned_char,_std::allocator<unsigned_char>_> chIV;
  CCrypter cKeyCrypter;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CCrypter::CCrypter(&cKeyCrypter);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&chIV,0x10,&local_79);
  uVar2 = *(undefined8 *)((nIV->super_base_blob<256U>).m_data._M_elems + 8);
  *(undefined8 *)
   chIV.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = *(undefined8 *)(nIV->super_base_blob<256U>).m_data._M_elems;
  *(undefined8 *)
   (chIV.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start + 8) = uVar2;
  new_iv._M_extent._M_extent_value =
       (long)chIV.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)chIV.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  new_iv._M_ptr =
       chIV.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  bVar3 = CCrypter::SetKey(&cKeyCrypter,vMasterKey,new_iv);
  if (bVar3) {
    bVar3 = CCrypter::Encrypt(&cKeyCrypter,vchPlaintext,vchCiphertext);
  }
  else {
    bVar3 = false;
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&chIV.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  CCrypter::~CCrypter(&cKeyCrypter);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool EncryptSecret(const CKeyingMaterial& vMasterKey, const CKeyingMaterial &vchPlaintext, const uint256& nIV, std::vector<unsigned char> &vchCiphertext)
{
    CCrypter cKeyCrypter;
    std::vector<unsigned char> chIV(WALLET_CRYPTO_IV_SIZE);
    memcpy(chIV.data(), &nIV, WALLET_CRYPTO_IV_SIZE);
    if(!cKeyCrypter.SetKey(vMasterKey, chIV))
        return false;
    return cKeyCrypter.Encrypt(vchPlaintext, vchCiphertext);
}